

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O2

int compare_ul(void *v1,void *v2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*v2 <= *v1) {
    uVar1 = (uint)(*v2 < *v1);
  }
  return uVar1;
}

Assistant:

int compare_ul(const void *v1, const void *v2) {
  const unsigned long *ul1 = (const unsigned long *)v1,
                      *ul2 = (const unsigned long *)v2;

  if (*ul1 < *ul2) {
    return -1;
  }
  if (*ul1 > *ul2) {
    return 1;
  }
  return 0;
}